

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

bool __thiscall SkipList::containsElement(SkipList *this,int value)

{
  Element *pEVar1;
  uint uVar2;
  Element *pEVar3;
  
  pEVar3 = &this->head;
  for (uVar2 = this->height; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
    pEVar1 = pEVar3;
    do {
      pEVar3 = pEVar1;
      pEVar1 = (pEVar3->next).
               super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar2];
    } while (pEVar1->value < value);
  }
  return (*(pEVar3->next).
           super__Vector_base<SkipList::Element_*,_std::allocator<SkipList::Element_*>_>._M_impl.
           super__Vector_impl_data._M_start)->value == value;
}

Assistant:

bool SkipList::containsElement(int value) {
    Element *p = &head;
    for (int i = height; i >= 0; --i) {
        while (p->next[i]->value < value) {
            p = p->next[i];
        }
    }

    // now either p == &head and x <= p->next[0]->key
    // or p != &head and p->key < x <= p->next[0]->key
    p = p->next[0];
    return p->value == value;  // x is at position p in list or in list
}